

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinMan.c
# Opt level: O0

void Min_ManClean(Min_Man_t *p,int nSupp)

{
  int iVar1;
  int nSupp_local;
  Min_Man_t *p_local;
  
  p->nVars = nSupp;
  iVar1 = Abc_BitWordNum(nSupp << 1);
  p->nWords = iVar1;
  memset(p->ppStore,0,(long)(nSupp + 1) << 3);
  p->nCubes = 0;
  return;
}

Assistant:

void Min_ManClean( Min_Man_t * p, int nSupp )
{
    // set the size of the cube manager
    p->nVars  = nSupp;
    p->nWords = Abc_BitWordNum(2*nSupp);
    // clean the storage
    memset( p->ppStore, 0, sizeof(Min_Cube_t *) * (nSupp + 1) );
    p->nCubes = 0;
}